

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

bool __thiscall Socket::makeBlock(Socket *this,bool enabled)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = false;
  uVar1 = fcntl(this->_fd,3,0);
  if (-1 < (int)uVar1) {
    if (enabled) {
      uVar1 = uVar1 & 0x7ffff7ff;
    }
    else {
      uVar1 = uVar1 | 0x800;
    }
    bVar3 = false;
    iVar2 = fcntl(this->_fd,4,(ulong)uVar1);
    if (iVar2 != -1) {
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool Socket::makeBlock( bool enabled )
{
#ifdef _WIN32
    u_long nonblocking = enabled ? 0 : 1;
    if (::ioctlsocket(_fd, FIONBIO, &nonblocking) == SOCKET_ERROR) {
        return false;
    }
#else
    int flags;
    if ((flags = ::fcntl(_fd, F_GETFL, NULL)) < 0) {
        return false;
    }
    if(enabled)
    {
        if (::fcntl(_fd, F_SETFL, flags & ~O_NONBLOCK) == -1) {
            return false;
        }
    }
    else
    {
        if (::fcntl(_fd, F_SETFL, flags | O_NONBLOCK) == -1) {
            return false;
        }
    }
#endif
    return true;
}